

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O3

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Lookup
          (PersistentStorageJson *this,Domain *aValue,
          vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
          *aRet)

{
  pointer pcVar1;
  undefined8 uVar2;
  code *pcVar3;
  Status SVar4;
  _func_void *p_Var5;
  function<bool_(const_ot::commissioner::persistent_storage::Domain_&)> pred;
  _Any_data __tmp;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  _Any_data local_a0;
  code *local_90;
  uint local_80;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  string local_58;
  
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_d0 = std::
             _Function_handler<bool_(const_ot::commissioner::persistent_storage::Domain_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:354:48)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<bool_(const_ot::commissioner::persistent_storage::Domain_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:354:48)>
             ::_M_manager;
  local_80 = (aValue->mId).mId;
  pcVar1 = (aValue->mName)._M_dataplus._M_p;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + (aValue->mName)._M_string_length);
  local_c8._8_8_ = 0;
  p_Var5 = (_func_void *)operator_new(0x28);
  *(uint *)p_Var5 = local_80;
  *(_func_void **)(p_Var5 + 8) = p_Var5 + 0x18;
  std::__cxx11::string::_M_construct<char*>((string *)(p_Var5 + 8),local_78,local_78 + local_70);
  pcVar3 = local_d8;
  local_c8._M_unused._M_object = local_e8._M_unused._M_object;
  uVar2 = local_e8._8_8_;
  local_e8._8_8_ = local_c8._8_8_;
  local_b8 = local_d8;
  local_d8 = std::
             _Function_handler<bool_(const_ot::commissioner::persistent_storage::Domain_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:356:12)>
             ::_M_manager;
  local_b0 = local_d0;
  local_d0 = std::
             _Function_handler<bool_(const_ot::commissioner::persistent_storage::Domain_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:356:12)>
             ::_M_invoke;
  local_e8._M_unused._M_function_pointer = p_Var5;
  local_c8._8_8_ = uVar2;
  if (pcVar3 != (code *)0x0) {
    (*pcVar3)(&local_c8,&local_c8,__destroy_functor);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  std::function<bool_(const_ot::commissioner::persistent_storage::Domain_&)>::function
            ((function<bool_(const_ot::commissioner::persistent_storage::Domain_&)> *)&local_a0,
             (function<bool_(const_ot::commissioner::persistent_storage::Domain_&)> *)&local_e8);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,JSON_DOM_abi_cxx11_,DAT_002e2848 + JSON_DOM_abi_cxx11_);
  SVar4 = LookupPred<ot::commissioner::persistent_storage::Domain>
                    (this,(function<bool_(const_ot::commissioner::persistent_storage::Domain_&)> *)
                          &local_a0,aRet,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (local_90 != (code *)0x0) {
    (*local_90)(&local_a0,&local_a0,__destroy_functor);
  }
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  return SVar4;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Lookup(Domain const &aValue, std::vector<Domain> &aRet)
{
    std::function<bool(Domain const &)> pred = [](Domain const &) { return true; };

    pred = [aValue](Domain const &el) {
        bool aRet = (aValue.mId.mId == EMPTY_ID || (el.mId.mId == aValue.mId.mId)) &&
                    (aValue.mName.empty() || (aValue.mName == el.mName));
        return aRet;
    };

    return LookupPred<Domain>(pred, aRet, JSON_DOM);
}